

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

void aGLDraw(AGLDrawSource *src,AGLDrawMerge *merge,AGLDrawTarget *target)

{
  undefined8 *puVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  AGLCullMode AVar5;
  AGLFrontFace AVar6;
  AGLDepthParams AVar7;
  AGLProgramUniform *pAVar8;
  AGLAttribute *pAVar9;
  int *piVar10;
  AGLBuffer *pAVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  AGLDepthMode AVar19;
  GLenum error;
  int iVar20;
  anon_struct_64_3_f175164b *paVar21;
  char *message;
  long lVar22;
  long lVar23;
  ulong uVar24;
  AGLDepthMode AVar25;
  
  a__GLTargetBind(target);
  AVar7 = merge->depth;
  AVar25 = AVar7.mode;
  AVar19 = a__gl_state.depth.mode;
  if (a__gl_state.depth.mode != AVar25) {
    AVar19 = AVar25;
    if (AVar25 == AGLDM_Disabled) {
      glDisable(0xb71);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1293: glDisable(GL_DEPTH_TEST) returned "
        ;
        goto LAB_00104ec3;
      }
    }
    else {
      glEnable();
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1295: glEnable(GL_DEPTH_TEST) returned "
        ;
        goto LAB_00104ec3;
      }
      glDepthMask(AVar25 == AGLDM_TestAndWrite);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1296: glDepthMask(depth.mode == AGLDM_TestAndWrite) returned "
        ;
        goto LAB_00104ec3;
      }
    }
  }
  a__gl_state.depth.mode = AVar19;
  if (a__gl_state.depth.mode != AGLDM_Disabled) {
    if (a__gl_state.depth.func != AVar7.func) {
      a__gl_state.depth.func = AVar7.func;
      glDepthFunc((ulong)AVar7 >> 0x20);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1305: glDepthFunc(cur->func = depth.func) returned "
        ;
        goto LAB_00104ec3;
      }
    }
  }
  iVar20 = (merge->blend).enable;
  if (iVar20 != a__gl_state.blend.enable) {
    a__gl_state.blend.enable = iVar20;
    if (iVar20 == 0) {
      glDisable(0xbe2);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1313: glDisable(GL_BLEND) returned "
        ;
        goto LAB_00104ec3;
      }
    }
    else {
      glEnable();
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1315: glEnable(GL_BLEND) returned "
        ;
        goto LAB_00104ec3;
      }
    }
  }
  if (a__gl_state.blend.enable != 0) {
    fVar2 = (merge->blend).color.r;
    if ((fVar2 != a__gl_state.blend.color.r) || (NAN(fVar2) || NAN(a__gl_state.blend.color.r))) {
LAB_001047d8:
      a__gl_state.blend.color = (merge->blend).color;
      glBlendColor(a__gl_state.blend.color.r,a__gl_state.blend.color.g,a__gl_state.blend.color.b,
                   a__gl_state.blend.color.a);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1324: glBlendColor(cur->color.r, cur->color.g, cur->color.b, cur->color.a) returned "
        ;
        goto LAB_00104ec3;
      }
    }
    else {
      fVar2 = (merge->blend).color.g;
      if ((fVar2 != a__gl_state.blend.color.g) || (NAN(fVar2) || NAN(a__gl_state.blend.color.g)))
      goto LAB_001047d8;
      fVar2 = (merge->blend).color.b;
      if ((fVar2 != a__gl_state.blend.color.b) || (NAN(fVar2) || NAN(a__gl_state.blend.color.b)))
      goto LAB_001047d8;
      fVar2 = (merge->blend).color.a;
      if ((fVar2 != a__gl_state.blend.color.a) || (NAN(fVar2) || NAN(a__gl_state.blend.color.a)))
      goto LAB_001047d8;
    }
    if (((merge->blend).equation.rgb != a__gl_state.blend.equation.rgb) ||
       ((merge->blend).equation.a != a__gl_state.blend.equation.a)) {
      a__gl_state.blend.equation = (merge->blend).equation;
      if (a__gl_state.blend.equation.rgb == a__gl_state.blend.equation.a) {
        glBlendEquation();
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1330: glBlendEquation(cur->equation.rgb) returned "
          ;
          goto LAB_00104ec3;
        }
      }
      else {
        glBlendEquationSeparate();
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1332: glBlendEquationSeparate(cur->equation.rgb, cur->equation.a) returned "
          ;
          goto LAB_00104ec3;
        }
      }
    }
    if (((((merge->blend).func.src_rgb != a__gl_state.blend.func.src_rgb) ||
         ((merge->blend).func.dst_rgb != a__gl_state.blend.func.dst_rgb)) ||
        ((merge->blend).func.src_a != a__gl_state.blend.func.src_a)) ||
       ((merge->blend).func.dst_a != a__gl_state.blend.func.dst_a)) {
      a__gl_state.blend.func = (merge->blend).func;
      if ((a__gl_state.blend.func.src_rgb == a__gl_state.blend.func.src_a) &&
         (a__gl_state.blend.func.dst_rgb == a__gl_state.blend.func.dst_a)) {
        glBlendFunc();
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1339: glBlendFunc(cur->func.src_rgb, cur->func.dst_rgb) returned "
          ;
          goto LAB_00104ec3;
        }
      }
      else {
        glBlendFuncSeparate(a__gl_state.blend.func.src_rgb,a__gl_state.blend.func.dst_rgb,
                            a__gl_state.blend.func.src_a,a__gl_state.blend.func.dst_a);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1341: glBlendFuncSeparate(cur->func.src_rgb, cur->func.dst_rgb, cur->func.src_a, cur->func.dst_a) returned "
          ;
          goto LAB_00104ec3;
        }
      }
    }
  }
  pAVar8 = (src->uniforms).p;
  uVar3 = (src->uniforms).n;
  glUseProgram(src->program);
  error = glGetError();
  if (error != 0) {
    message = 
    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1180: glUseProgram(program) returned "
    ;
    goto LAB_00104ec3;
  }
  if (0 < (int)uVar3) {
    lVar22 = 0;
    iVar20 = 0;
    do {
      iVar4 = *(int *)((long)&(pAVar8->_).location + lVar22);
      if (iVar4 != -1) {
        switch(*(undefined4 *)((long)&pAVar8->type + lVar22)) {
        case 0:
          glUniform1fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1188: glUniform1fv(loc, uniforms[i].count, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 1:
          glUniform2fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1189: glUniform2fv(loc, uniforms[i].count, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 2:
          glUniform3fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1190: glUniform3fv(loc, uniforms[i].count, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 3:
          glUniform4fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1191: glUniform4fv(loc, uniforms[i].count, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 4:
          glUniformMatrix2fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),0,
                             *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1192: glUniformMatrix2fv(loc, uniforms[i].count, GL_FALSE, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 5:
          glUniformMatrix3fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),0,
                             *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1193: glUniformMatrix3fv(loc, uniforms[i].count, GL_FALSE, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 6:
          glUniformMatrix4fv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),0,
                             *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1194: glUniformMatrix4fv(loc, uniforms[i].count, GL_FALSE, uniforms[i].value.pf) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 7:
          glUniform1iv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1195: glUniform1iv(loc, uniforms[i].count, uniforms[i].value.pi) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 8:
          glUniform2iv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1196: glUniform2iv(loc, uniforms[i].count, uniforms[i].value.pi) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 9:
          glUniform3iv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1197: glUniform3iv(loc, uniforms[i].count, uniforms[i].value.pi) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 10:
          glUniform4iv(iVar4,*(undefined4 *)((long)&pAVar8->count + lVar22),
                       *(undefined8 *)((long)&pAVar8->value + lVar22));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1198: glUniform4iv(loc, uniforms[i].count, uniforms[i].value.pi) returned "
            ;
            goto LAB_00104ec3;
          }
          break;
        case 0xb:
          lVar23 = *(long *)((long)&pAVar8->value + lVar22);
          glActiveTexture(iVar20 + 0x84c0);
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1227: glActiveTexture(GL_TEXTURE0 + unit) returned "
            ;
            goto LAB_00104ec3;
          }
          glBindTexture(0xde1,*(undefined4 *)(lVar23 + 0x24));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1228: glBindTexture(GL_TEXTURE_2D, texture->_.name) returned "
            ;
            goto LAB_00104ec3;
          }
          if (*(int *)(lVar23 + 0x28) != *(int *)(lVar23 + 0x14)) {
            glTexParameteri(0xde1,0x2801);
            error = glGetError();
            if (error != 0) {
              message = 
              "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1232: glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, mutable_texture->min_filter) returned "
              ;
              goto LAB_00104ec3;
            }
            *(undefined4 *)(lVar23 + 0x28) = *(undefined4 *)(lVar23 + 0x14);
          }
          if (*(int *)(lVar23 + 0x2c) != *(int *)(lVar23 + 0x18)) {
            glTexParameteri(0xde1,0x2800);
            error = glGetError();
            if (error != 0) {
              message = 
              "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1236: glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, mutable_texture->mag_filter) returned "
              ;
              goto LAB_00104ec3;
            }
            *(undefined4 *)(lVar23 + 0x2c) = *(undefined4 *)(lVar23 + 0x18);
          }
          if (*(int *)(lVar23 + 0x30) != *(int *)(lVar23 + 0x1c)) {
            glTexParameteri(0xde1,0x2802);
            error = glGetError();
            if (error != 0) {
              message = 
              "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1240: glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, mutable_texture->wrap_s) returned "
              ;
              goto LAB_00104ec3;
            }
            *(undefined4 *)(lVar23 + 0x30) = *(undefined4 *)(lVar23 + 0x1c);
          }
          if (*(int *)(lVar23 + 0x34) != *(int *)(lVar23 + 0x20)) {
            glTexParameteri(0xde1,0x2803);
            error = glGetError();
            if (error != 0) {
              message = 
              "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1244: glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, mutable_texture->wrap_t) returned "
              ;
              goto LAB_00104ec3;
            }
            *(undefined4 *)(lVar23 + 0x34) = *(undefined4 *)(lVar23 + 0x20);
          }
          glUniform1i(iVar4,iVar20);
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1201: glUniform1i(loc, texture_unit) returned "
            ;
            goto LAB_00104ec3;
          }
          iVar20 = iVar20 + 1;
        }
      }
      lVar22 = lVar22 + 0x20;
    } while ((ulong)uVar3 << 5 != lVar22);
  }
  pAVar9 = (src->attribs).p;
  lVar22 = (long)(int)(src->attribs).n;
  a__gl_state.attribs_serial = a__gl_state.attribs_serial + 1;
  if (0 < lVar22) {
    lVar23 = 0;
    do {
      piVar10 = *(int **)((long)&pAVar9->buffer + lVar23);
      iVar20 = 0;
      if (piVar10 != (int *)0x0) {
        iVar20 = *piVar10;
      }
      uVar3 = *(uint *)((long)&(pAVar9->_).location + lVar23);
      if (-1 < (int)uVar3) {
        if (a__gl_state.attribs[uVar3].buffer < 0) {
          glEnableVertexAttribArray(uVar3);
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1265: glEnableVertexAttribArray(loc) returned "
            ;
            goto LAB_00104ec3;
          }
        }
        if (a__gl_state.attribs[uVar3].buffer != iVar20) {
          glBindBuffer(0x8892,iVar20);
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1267: glBindBuffer(GL_ARRAY_BUFFER, buffer) returned "
            ;
            goto LAB_00104ec3;
          }
          a__gl_state.attribs[uVar3].buffer = iVar20;
        }
        a__gl_state.attribs[uVar3].serial = a__gl_state.attribs_serial;
        iVar20 = *(int *)((long)&pAVar9->size + lVar23);
        if (((a__gl_state.attribs[uVar3].attrib.size != iVar20) ||
            (a__gl_state.attribs[uVar3].attrib.type != *(GLenum *)((long)&pAVar9->type + lVar23)))
           || ((a__gl_state.attribs[uVar3].attrib.normalized != (&pAVar9->normalized)[lVar23] ||
               ((a__gl_state.attribs[uVar3].attrib.stride !=
                 *(int *)((long)&pAVar9->stride + lVar23) ||
                (a__gl_state.attribs[uVar3].attrib.ptr != *(GLvoid **)((long)&pAVar9->ptr + lVar23))
                ))))) {
          glVertexAttribPointer
                    (uVar3,iVar20,*(undefined4 *)((long)&pAVar9->type + lVar23),
                     (&pAVar9->normalized)[lVar23],*(undefined4 *)((long)&pAVar9->stride + lVar23),
                     *(undefined8 *)((long)&pAVar9->ptr + lVar23));
          error = glGetError();
          if (error != 0) {
            message = 
            "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1275: glVertexAttribPointer(loc, a->size, a->type, a->normalized, a->stride, a->ptr) returned "
            ;
            goto LAB_00104ec3;
          }
          puVar1 = (undefined8 *)((long)&(pAVar9->_).location + lVar23);
          uVar12 = *(undefined4 *)(puVar1 + -5);
          uVar13 = *(undefined4 *)((long)puVar1 + -0x24);
          uVar14 = *(undefined4 *)(puVar1 + -4);
          uVar15 = *(undefined4 *)((long)puVar1 + -0x1c);
          uVar16 = puVar1[-3];
          uVar17 = puVar1[-2];
          uVar18 = *puVar1;
          a__gl_state.attribs[uVar3].attrib.ptr = (GLvoid *)puVar1[-1];
          *(undefined8 *)&a__gl_state.attribs[uVar3].attrib._ = uVar18;
          a__gl_state.attribs[uVar3].attrib.size = (int)uVar16;
          a__gl_state.attribs[uVar3].attrib.type = (int)((ulong)uVar16 >> 0x20);
          paVar21 = a__gl_state.attribs + uVar3;
          (paVar21->attrib).normalized = (char)uVar17;
          *(int3 *)&(paVar21->attrib).field_0x19 = (int3)((ulong)uVar17 >> 8);
          (paVar21->attrib).stride = (int)((ulong)uVar17 >> 0x20);
          *(undefined4 *)&a__gl_state.attribs[uVar3].attrib.name = uVar12;
          *(undefined4 *)((long)&a__gl_state.attribs[uVar3].attrib.name + 4) = uVar13;
          *(undefined4 *)&a__gl_state.attribs[uVar3].attrib.buffer = uVar14;
          *(undefined4 *)((long)&a__gl_state.attribs[uVar3].attrib.buffer + 4) = uVar15;
        }
      }
      lVar23 = lVar23 + 0x30;
    } while (lVar22 * 0x30 != lVar23);
  }
  paVar21 = a__gl_state.attribs;
  uVar24 = 0;
  do {
    if ((-1 < paVar21->buffer) && (paVar21->serial != a__gl_state.attribs_serial)) {
      glDisableVertexAttribArray(uVar24 & 0xffffffff);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1282: glDisableVertexAttribArray(i) returned "
        ;
        goto LAB_00104ec3;
      }
      paVar21->buffer = -1;
    }
    uVar24 = uVar24 + 1;
    paVar21 = paVar21 + 1;
  } while (uVar24 != 8);
  AVar5 = (src->primitive).cull_mode;
  AVar6 = (src->primitive).front_face;
  if (a__gl_state.cull_mode == AVar5) {
LAB_00104da7:
    if (a__gl_state.front_face != AVar6) {
      a__gl_state.front_face = AVar6;
      glFrontFace(AVar6);
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1361: glFrontFace(a__gl_state.front_face = front) returned "
        ;
        goto LAB_00104ec3;
      }
    }
  }
  else if (AVar5 == AGLCM_Disable) {
    glDisable(0xb44);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1348: glDisable(GL_CULL_FACE) returned "
      ;
      goto LAB_00104ec3;
    }
  }
  else {
    if (a__gl_state.cull_mode != AGLCM_Disable) {
      a__gl_state.cull_mode = AVar5;
      glCullFace();
      error = glGetError();
      if (error != 0) {
        message = 
        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1357: glCullFace(a__gl_state.cull_mode = cull) returned "
        ;
        goto LAB_00104ec3;
      }
      goto LAB_00104da7;
    }
    glEnable(0xb44);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1353: glEnable(GL_CULL_FACE) returned "
      ;
      goto LAB_00104ec3;
    }
  }
  pAVar11 = (src->primitive).index.buffer;
  if (pAVar11 == (AGLBuffer *)0x0) {
    if ((src->primitive).index.data.ptr == (GLvoid *)0x0) {
      glDrawArrays((src->primitive).mode,(src->primitive).first,(src->primitive).count);
      error = glGetError();
      if (error == 0) {
        return;
      }
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1142: glDrawArrays(src->primitive.mode, src->primitive.first, src->primitive.count) returned "
      ;
      goto LAB_00104ec3;
    }
    glBindBuffer(0x8893,0);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1136: glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0) returned "
      ;
      goto LAB_00104ec3;
    }
  }
  else {
    glBindBuffer(0x8893,pAVar11->name);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1134: glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, src->primitive.index.buffer->name) returned "
      ;
      goto LAB_00104ec3;
    }
  }
  glDrawElements((src->primitive).mode,(src->primitive).count,(src->primitive).index.type,
                 (src->primitive).index.data.ptr);
  error = glGetError();
  if (error == 0) {
    return;
  }
  message = 
  "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1140: glDrawElements( src->primitive.mode, src->primitive.count, src->primitive.index.type, src->primitive.index.data.ptr) returned "
  ;
LAB_00104ec3:
  a__GlPrintError(message,error);
  abort();
}

Assistant:

void aGLDraw(const AGLDrawSource *src, const AGLDrawMerge *merge, const AGLDrawTarget *target) {
	ATTO_GL_PROFILE_PREAMBLE
	a__GLTargetBind(target);

	a__GLDepthBind(merge->depth);
	a__GLBlendBind(&merge->blend);

	a__GLProgramBind(src->program, src->uniforms.p, src->uniforms.n);
	a__GLAttribsBind(src->attribs.p, src->attribs.n);
	a__GLCullingBind(src->primitive.cull_mode, src->primitive.front_face);

	if (src->primitive.index.buffer || src->primitive.index.data.ptr) {
		if (src->primitive.index.buffer) {
			/* FIXME store binding in state */
			AGL__CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, src->primitive.index.buffer->name));
		} else {
			AGL__CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0));
		}

		AGL__CALL(glDrawElements(
			src->primitive.mode, src->primitive.count, src->primitive.index.type, src->primitive.index.data.ptr));
	} else
		AGL__CALL(glDrawArrays(src->primitive.mode, src->primitive.first, src->primitive.count));
	ATTO_GL_PROFILE_FUNC("aGLDraw", aAppTime() - start);
}